

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int reportComment(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  XML_Char *s;
  XML_Char *data;
  char *end_local;
  char *start_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  if (parser->m_commentHandler == (XML_CommentHandler)0x0) {
    if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
      reportDefault(parser,enc,start,end);
    }
    parser_local._4_4_ = 1;
  }
  else {
    s = poolStoreString(&parser->m_tempPool,enc,start + (enc->minBytesPerChar << 2),
                        end + -(long)(enc->minBytesPerChar * 3));
    if (s == (XML_Char *)0x0) {
      parser_local._4_4_ = 0;
    }
    else {
      normalizeLines(s);
      (*parser->m_commentHandler)(parser->m_handlerArg,s);
      poolClear(&parser->m_tempPool);
      parser_local._4_4_ = 1;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
reportComment(XML_Parser parser, const ENCODING *enc, const char *start,
              const char *end) {
  XML_Char *data;
  if (! parser->m_commentHandler) {
    if (parser->m_defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  data = poolStoreString(&parser->m_tempPool, enc,
                         start + enc->minBytesPerChar * 4,
                         end - enc->minBytesPerChar * 3);
  if (! data)
    return 0;
  normalizeLines(data);
  parser->m_commentHandler(parser->m_handlerArg, data);
  poolClear(&parser->m_tempPool);
  return 1;
}